

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O1

FProduction * ProdAddStr(FStringProd *prod1,FStringProd *prod2)

{
  size_t sVar1;
  size_t sVar2;
  FProduction *pFVar3;
  
  sVar1 = strlen(prod1->Value);
  sVar2 = strlen(prod2->Value);
  pFVar3 = (FProduction *)
           M_Malloc_Dbg(sVar1 + sVar2 + 9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                        ,0x143);
  pFVar3->Type = PROD_String;
  *(undefined1 *)&pFVar3[1].Type = PROD_String;
  strcpy((char *)(pFVar3 + 1),prod1->Value);
  strcat((char *)(pFVar3 + 1),prod2->Value);
  return pFVar3;
}

Assistant:

FProduction *ProdAddStr (FStringProd *prod1, FStringProd *prod2)
{
	size_t len = strlen (prod1->Value) + strlen (prod2->Value) + 1;
	FStringProd *prod = NewStringProd (len);
	strcpy (prod->Value, prod1->Value);
	strcat (prod->Value, prod2->Value);
	return prod;
}